

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_complete(mbedtls_rsa_context *ctx)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi *X_02;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  int extraout_EDX;
  ulong uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  bool bVar13;
  mbedtls_mpi *X_03;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  
  X_03 = &ctx->N;
  iVar4 = mbedtls_mpi_cmp_int(X_03,0);
  X = &ctx->P;
  iVar5 = mbedtls_mpi_cmp_int(X,0);
  X_00 = &ctx->Q;
  iVar6 = mbedtls_mpi_cmp_int(X_00,0);
  X_01 = &ctx->D;
  iVar7 = mbedtls_mpi_cmp_int(X_01,0);
  X_02 = &ctx->E;
  iVar8 = mbedtls_mpi_cmp_int(X_02,0);
  bVar15 = iVar8 != 0;
  iVar8 = mbedtls_mpi_cmp_int(&ctx->DP,0);
  iVar9 = mbedtls_mpi_cmp_int(&ctx->DQ,0);
  iVar10 = mbedtls_mpi_cmp_int(&ctx->QP,0);
  bVar13 = iVar6 != 0 && iVar5 != 0;
  bVar2 = iVar5 == 0;
  bVar3 = iVar6 == 0;
  bVar1 = iVar4 != 0;
  bVar16 = iVar7 == 0;
  bVar14 = bVar13;
  if (!bVar16) {
    bVar14 = bVar13 || (bVar2 && bVar3) && bVar1;
  }
  if (((~(((iVar5 != 0 || iVar6 != 0) || iVar4 == 0) || !bVar16) | bVar14) & bVar15) != 1) {
    return -0x4080;
  }
  uVar12 = (ulong)CONCAT31((int3)((uint)iVar10 >> 8),iVar4 == 0);
  if ((iVar5 != 0 && iVar6 != 0) && iVar4 == 0) {
    iVar4 = mbedtls_mpi_mul_mpi(X_03,X,X_00);
    if (iVar4 != 0) goto LAB_0049f26b;
    sVar11 = mbedtls_mpi_size(X_03);
    ctx->len = sVar11;
    uVar12 = extraout_RDX;
  }
  if ((!bVar16 && bVar15) && ((bVar2 && bVar3) && bVar1)) {
    iVar4 = mbedtls_rsa_deduce_primes(X_03,X_02,X_01,X,X_00);
    uVar12 = extraout_RDX_00;
LAB_0049f21b:
    if (iVar4 != 0) goto LAB_0049f26b;
  }
  else if (bVar13 && (bVar16 && bVar15)) {
    iVar4 = mbedtls_rsa_deduce_private_exponent(X,X_00,X_02,X_01);
    uVar12 = extraout_RDX_01;
    goto LAB_0049f21b;
  }
  iVar5 = (int)CONCAT71((int7)(uVar12 >> 8),iVar9 == 0);
  if ((((bVar14 & bVar15) == 0) || ((iVar8 != 0 && iVar9 != 0) && iVar10 != 0)) ||
     (iVar4 = mbedtls_rsa_deduce_crt(X,X_00,X_01,&ctx->DP,&ctx->DQ,&ctx->QP), iVar5 = extraout_EDX,
     iVar4 == 0)) {
    iVar4 = rsa_check_context(ctx,(uint)(byte)(bVar14 & bVar15),iVar5);
    return iVar4;
  }
LAB_0049f26b:
  return iVar4 + -0x4080;
}

Assistant:

int mbedtls_rsa_complete(mbedtls_rsa_context *ctx)
{
    int ret = 0;
    int have_N, have_P, have_Q, have_D, have_E;
#if !defined(MBEDTLS_RSA_NO_CRT)
    int have_DP, have_DQ, have_QP;
#endif
    int n_missing, pq_missing, d_missing, is_pub, is_priv;

    have_N = (mbedtls_mpi_cmp_int(&ctx->N, 0) != 0);
    have_P = (mbedtls_mpi_cmp_int(&ctx->P, 0) != 0);
    have_Q = (mbedtls_mpi_cmp_int(&ctx->Q, 0) != 0);
    have_D = (mbedtls_mpi_cmp_int(&ctx->D, 0) != 0);
    have_E = (mbedtls_mpi_cmp_int(&ctx->E, 0) != 0);

#if !defined(MBEDTLS_RSA_NO_CRT)
    have_DP = (mbedtls_mpi_cmp_int(&ctx->DP, 0) != 0);
    have_DQ = (mbedtls_mpi_cmp_int(&ctx->DQ, 0) != 0);
    have_QP = (mbedtls_mpi_cmp_int(&ctx->QP, 0) != 0);
#endif

    /*
     * Check whether provided parameters are enough
     * to deduce all others. The following incomplete
     * parameter sets for private keys are supported:
     *
     * (1) P, Q missing.
     * (2) D and potentially N missing.
     *
     */

    n_missing  =              have_P &&  have_Q &&  have_D && have_E;
    pq_missing =   have_N && !have_P && !have_Q &&  have_D && have_E;
    d_missing  =              have_P &&  have_Q && !have_D && have_E;
    is_pub     =   have_N && !have_P && !have_Q && !have_D && have_E;

    /* These three alternatives are mutually exclusive */
    is_priv = n_missing || pq_missing || d_missing;

    if (!is_priv && !is_pub) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /*
     * Step 1: Deduce N if P, Q are provided.
     */

    if (!have_N && have_P && have_Q) {
        if ((ret = mbedtls_mpi_mul_mpi(&ctx->N, &ctx->P,
                                       &ctx->Q)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }

        ctx->len = mbedtls_mpi_size(&ctx->N);
    }

    /*
     * Step 2: Deduce and verify all remaining core parameters.
     */

    if (pq_missing) {
        ret = mbedtls_rsa_deduce_primes(&ctx->N, &ctx->E, &ctx->D,
                                        &ctx->P, &ctx->Q);
        if (ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }

    } else if (d_missing) {
        if ((ret = mbedtls_rsa_deduce_private_exponent(&ctx->P,
                                                       &ctx->Q,
                                                       &ctx->E,
                                                       &ctx->D)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }
    }

    /*
     * Step 3: Deduce all additional parameters specific
     *         to our current RSA implementation.
     */

#if !defined(MBEDTLS_RSA_NO_CRT)
    if (is_priv && !(have_DP && have_DQ && have_QP)) {
        ret = mbedtls_rsa_deduce_crt(&ctx->P,  &ctx->Q,  &ctx->D,
                                     &ctx->DP, &ctx->DQ, &ctx->QP);
        if (ret != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
        }
    }
#endif /* MBEDTLS_RSA_NO_CRT */

    /*
     * Step 3: Basic sanity checks
     */

    return rsa_check_context(ctx, is_priv, 1);
}